

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_rasterizer_cells_aa.h
# Opt level: O0

void __thiscall
agg::rasterizer_cells_aa<agg::cell_aa>::allocate_block(rasterizer_cells_aa<agg::cell_aa> *this)

{
  uint uVar1;
  cell_aa **__dest;
  cell_aa *pcVar2;
  cell_type **new_cells;
  rasterizer_cells_aa<agg::cell_aa> *this_local;
  
  if (this->m_num_blocks <= this->m_curr_block) {
    if (this->m_max_blocks <= this->m_num_blocks) {
      __dest = pod_allocator<agg::cell_aa_*>::allocate(this->m_max_blocks + 0x100);
      if (this->m_cells != (cell_type **)0x0) {
        memcpy(__dest,this->m_cells,(ulong)this->m_max_blocks << 3);
        pod_allocator<agg::cell_aa_*>::deallocate(this->m_cells,this->m_max_blocks);
      }
      this->m_cells = __dest;
      this->m_max_blocks = this->m_max_blocks + 0x100;
    }
    pcVar2 = pod_allocator<agg::cell_aa>::allocate(0x1000);
    uVar1 = this->m_num_blocks;
    this->m_num_blocks = uVar1 + 1;
    this->m_cells[uVar1] = pcVar2;
  }
  uVar1 = this->m_curr_block;
  this->m_curr_block = uVar1 + 1;
  this->m_curr_cell_ptr = this->m_cells[uVar1];
  return;
}

Assistant:

void rasterizer_cells_aa<Cell>::allocate_block()
    {
        if(m_curr_block >= m_num_blocks)
        {
            if(m_num_blocks >= m_max_blocks)
            {
                cell_type** new_cells = 
                    pod_allocator<cell_type*>::allocate(m_max_blocks + 
                                                        cell_block_pool);

                if(m_cells)
                {
                    memcpy(new_cells, m_cells, m_max_blocks * sizeof(cell_type*));
                    pod_allocator<cell_type*>::deallocate(m_cells, m_max_blocks);
                }
                m_cells = new_cells;
                m_max_blocks += cell_block_pool;
            }

            m_cells[m_num_blocks++] = 
                pod_allocator<cell_type>::allocate(cell_block_size);

        }
        m_curr_cell_ptr = m_cells[m_curr_block++];
    }